

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

void Abc_SclLinkCells(SC_Lib *p)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  void **ppvVar5;
  uint *__ptr;
  void *pvVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  void *pvVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  
  if ((p->vCellClasses).nSize != 0) {
    __assert_fail("Vec_PtrSize(&p->vCellClasses) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibUtil.c"
                  ,0x10b,"void Abc_SclLinkCells(SC_Lib *)");
  }
  if (0 < (p->vCells).nSize) {
    lVar14 = 0;
    pvVar6 = (void *)0x0;
    do {
      pvVar11 = (p->vCells).pArray[lVar14];
      uVar4 = (p->vCellClasses).nSize;
      uVar8 = 0;
      if (0 < (long)(int)uVar4) {
        uVar13 = *(uint *)((long)pvVar11 + 0x40);
        uVar8 = 0;
        do {
          pvVar6 = (p->vCellClasses).pArray[uVar8];
          uVar1 = *(uint *)((long)pvVar6 + 0x40);
          if ((uVar13 == uVar1) && (*(int *)((long)pvVar11 + 0x44) == *(int *)((long)pvVar6 + 0x44))
             ) {
            if (((int)uVar13 < 0) ||
               (((*(int *)((long)pvVar11 + 0x34) <= (int)uVar13 || ((int)uVar1 < 0)) ||
                (*(int *)((long)pvVar6 + 0x34) <= (int)uVar1)))) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            lVar2 = *(long *)(*(long *)((long)pvVar11 + 0x38) + (ulong)uVar13 * 8);
            lVar3 = *(long *)(*(long *)((long)pvVar6 + 0x38) + (ulong)uVar1 * 8);
            uVar1 = *(uint *)(lVar2 + 0x34);
            if (uVar1 == *(uint *)(lVar3 + 0x34)) {
              if ((int)uVar1 < 1) goto LAB_004684ff;
              uVar12 = 0;
              while (*(long *)(*(long *)(lVar2 + 0x38) + uVar12 * 8) ==
                     *(long *)(*(long *)(lVar3 + 0x38) + uVar12 * 8)) {
                uVar12 = uVar12 + 1;
                if (uVar1 == uVar12) goto LAB_004684ff;
              }
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != (long)(int)uVar4);
        uVar8 = (ulong)uVar4;
      }
LAB_004684ff:
      if ((uint)uVar8 == uVar4) {
        uVar13 = (p->vCellClasses).nCap;
        if (uVar4 == uVar13) {
          if ((int)uVar13 < 0x10) {
            ppvVar5 = (p->vCellClasses).pArray;
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(ppvVar5,0x80);
            }
            (p->vCellClasses).pArray = ppvVar5;
            iVar10 = 0x10;
          }
          else {
            iVar10 = uVar13 * 2;
            if (iVar10 <= (int)uVar13) goto LAB_00468582;
            ppvVar5 = (p->vCellClasses).pArray;
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar13 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar13 << 4);
            }
            (p->vCellClasses).pArray = ppvVar5;
          }
          (p->vCellClasses).nCap = iVar10;
        }
LAB_00468582:
        iVar10 = (p->vCellClasses).nSize;
        (p->vCellClasses).nSize = iVar10 + 1;
        (p->vCellClasses).pArray[iVar10] = pvVar11;
        *(void **)((long)pvVar11 + 0x50) = pvVar11;
        plVar7 = (long *)((long)pvVar11 + 0x48);
      }
      else {
        plVar7 = (long *)((long)pvVar6 + 0x50);
        lVar2 = *(long *)((long)pvVar6 + 0x50);
        *(void **)(lVar2 + 0x48) = pvVar11;
        *(void **)((long)pvVar11 + 0x48) = pvVar6;
        *(long *)((long)pvVar11 + 0x50) = lVar2;
      }
      *plVar7 = (long)pvVar11;
      lVar14 = lVar14 + 1;
    } while (lVar14 < (p->vCells).nSize);
  }
  qsort((p->vCellClasses).pArray,(long)(p->vCellClasses).nSize,8,Abc_SclCompareCells);
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar6 = malloc(800);
  *(void **)(__ptr + 2) = pvVar6;
  if (0 < (p->vCellClasses).nSize) {
    lVar14 = 0;
    do {
      pvVar6 = (p->vCellClasses).pArray[lVar14];
      __ptr[1] = 0;
      uVar4 = *__ptr;
      plVar7 = *(long **)(__ptr + 2);
      pvVar11 = pvVar6;
      uVar8 = 0;
      do {
        uVar12 = uVar8;
        if (uVar12 == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (plVar7 == (long *)0x0) {
              plVar7 = (long *)malloc(0x80);
            }
            else {
              plVar7 = (long *)realloc(plVar7,0x80);
            }
            uVar4 = 0x10;
          }
          else {
            uVar13 = uVar4 * 2;
            if (SBORROW4(uVar4,uVar13) != 0 < (int)uVar4) {
              uVar4 = uVar13;
              if (plVar7 == (long *)0x0) {
                plVar7 = (long *)malloc((ulong)uVar13 << 3);
              }
              else {
                plVar7 = (long *)realloc(plVar7,(ulong)uVar13 << 3);
              }
            }
          }
        }
        uVar8 = uVar12 + 1;
        plVar7[uVar12] = (long)pvVar11;
        pvVar11 = *(void **)((long)pvVar11 + 0x48);
      } while (pvVar11 != pvVar6);
      uVar13 = (uint)uVar8;
      __ptr[1] = uVar13;
      *__ptr = uVar4;
      *(long **)(__ptr + 2) = plVar7;
      qsort(plVar7,uVar8,8,Abc_SclCompareCells);
      pvVar6 = (void *)*plVar7;
      *(void **)((long)pvVar6 + 0x50) = pvVar6;
      *(void **)((long)pvVar6 + 0x48) = pvVar6;
      *(void **)((long)pvVar6 + 0x58) = pvVar6;
      uVar9 = uVar8 >> 1 & 0x7fffffff;
      *(long *)((long)pvVar6 + 0x60) = plVar7[uVar9];
      *(undefined4 *)((long)pvVar6 + 0x68) = 0;
      *(uint *)((long)pvVar6 + 0x6c) = uVar13;
      if (uVar8 != 1) {
        uVar8 = 0;
        do {
          lVar2 = plVar7[uVar8 + 1];
          lVar3 = *(long *)((long)pvVar6 + 0x50);
          *(long *)(lVar3 + 0x48) = lVar2;
          *(void **)(lVar2 + 0x48) = pvVar6;
          *(long *)(lVar2 + 0x50) = lVar3;
          *(long *)((long)pvVar6 + 0x50) = lVar2;
          *(void **)(lVar2 + 0x58) = pvVar6;
          *(long *)(lVar2 + 0x60) = plVar7[uVar9];
          uVar8 = uVar8 + 1;
          *(int *)(lVar2 + 0x68) = (int)uVar8;
          *(uint *)(lVar2 + 0x6c) = uVar13;
        } while (uVar12 != uVar8);
      }
      if ((p->vCellClasses).nSize <= lVar14) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      (p->vCellClasses).pArray[lVar14] = pvVar6;
      lVar14 = lVar14 + 1;
    } while (lVar14 < (p->vCellClasses).nSize);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_SclLinkCells( SC_Lib * p )
{
    Vec_Ptr_t * vList;
    SC_Cell * pCell, * pRepr = NULL;
    int i, k;
    assert( Vec_PtrSize(&p->vCellClasses) == 0 );
    SC_LibForEachCell( p, pCell, i )
    {
        // find gate with the same function
        SC_LibForEachCellClass( p, pRepr, k )
            if ( pCell->n_inputs  == pRepr->n_inputs && 
                 pCell->n_outputs == pRepr->n_outputs && 
                 Vec_WrdEqual(SC_CellFunc(pCell), SC_CellFunc(pRepr)) )
                break;
        if ( k == Vec_PtrSize(&p->vCellClasses) )
        {
            Vec_PtrPush( &p->vCellClasses, pCell );
            pCell->pNext = pCell->pPrev = pCell;
            continue;
        }
        // add it to the list before the cell
        pRepr->pPrev->pNext = pCell; pCell->pNext = pRepr;
        pCell->pPrev = pRepr->pPrev; pRepr->pPrev = pCell;
    }
    // sort cells by size then by name
    qsort( (void *)Vec_PtrArray(&p->vCellClasses), Vec_PtrSize(&p->vCellClasses), sizeof(void *), (int(*)(const void *,const void *))Abc_SclCompareCells );
    // sort cell lists
    vList = Vec_PtrAlloc( 100 );
    SC_LibForEachCellClass( p, pRepr, k )
    {
        Vec_PtrClear( vList );
        SC_RingForEachCell( pRepr, pCell, i )
            Vec_PtrPush( vList, pCell );
        qsort( (void *)Vec_PtrArray(vList), (size_t)Vec_PtrSize(vList), sizeof(void *), (int(*)(const void *,const void *))Abc_SclCompareCells );
        // create new representative
        pRepr = (SC_Cell *)Vec_PtrEntry( vList, 0 );
        pRepr->pNext = pRepr->pPrev = pRepr;
        pRepr->pRepr = pRepr;
        pRepr->pAve  = (SC_Cell *)Vec_PtrEntry( vList, Vec_PtrSize(vList)/2 );
        pRepr->Order = 0;
        pRepr->nGates = Vec_PtrSize(vList);
        // relink cells
        Vec_PtrForEachEntryStart( SC_Cell *, vList, pCell, i, 1 )
        {
            pRepr->pPrev->pNext = pCell; pCell->pNext = pRepr;
            pCell->pPrev = pRepr->pPrev; pRepr->pPrev = pCell;
            pCell->pRepr = pRepr;
            pCell->pAve  = (SC_Cell *)Vec_PtrEntry( vList, Vec_PtrSize(vList)/2 );
            pCell->Order = i;
            pCell->nGates = Vec_PtrSize(vList);
        }
        // update list
        Vec_PtrWriteEntry( &p->vCellClasses, k, pRepr );
    }
    Vec_PtrFree( vList );
}